

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O1

void duckdb::VarSampOperation::Finalize<double,duckdb::StddevState>
               (StddevState *state,double *target,AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  long lVar2;
  OutOfRangeException *this;
  double value;
  undefined1 auVar3 [16];
  string local_40;
  
  if (state->count < 2) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  lVar2 = state->count - 1;
  auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar3._0_8_ = lVar2;
  auVar3._12_4_ = 0x45300000;
  value = state->dsquared /
          ((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
  *target = value;
  bVar1 = Value::DoubleIsFinite(value);
  if (bVar1) {
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"VARSAMP is out of range!","");
  OutOfRangeException::OutOfRangeException(this,&local_40);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count <= 1) {
			finalize_data.ReturnNull();
		} else {
			target = state.dsquared / (state.count - 1);
			if (!Value::DoubleIsFinite(target)) {
				throw OutOfRangeException("VARSAMP is out of range!");
			}
		}
	}